

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

LY_ERR lys_parse_in(ly_ctx *ctx,ly_in *in,LYS_INFORMAT format,
                   _func_LY_ERR_ly_ctx_ptr_lysp_module_ptr_lysp_submodule_ptr_void_ptr *custom_check
                   ,void *check_data,ly_set *new_mods,lys_module **module)

{
  lysp_revision *value;
  bool bVar1;
  ly_set *new_mods_00;
  byte bVar2;
  LY_ERR LVar3;
  int iVar4;
  lys_module *mod;
  lys_module *plVar5;
  ly_err_item *plVar6;
  char *format_00;
  LY_ERR err;
  LY_LOG_LEVEL level;
  ly_ctx *ctx_00;
  char *pcVar7;
  char *pcVar8;
  lysp_yang_ctx **context;
  lysp_yin_ctx *yinctx;
  lysp_yang_ctx *yangctx;
  lysf_ctx fctx;
  lysp_yang_ctx *local_90;
  lys_module *local_88;
  lysp_yang_ctx *local_78;
  lysp_yang_ctx *local_70;
  ly_set *local_68;
  void *local_60;
  lysf_ctx local_58;
  
  local_70 = (lysp_yang_ctx *)0x0;
  local_78 = (lysp_yang_ctx *)0x0;
  local_58.mod = (lys_module *)0x0;
  local_58.ext_set.size = 0;
  local_58.ext_set.count = 0;
  local_58.ext_set.field_2.dnodes = (lyd_node **)0x0;
  local_58.ctx = ctx;
  if (((ctx == (ly_ctx *)0x0) || (in == (ly_in *)0x0)) || (new_mods == (ly_set *)0x0)) {
    __assert_fail("ctx && in && new_mods",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema.c"
                  ,0x721,
                  "LY_ERR lys_parse_in(struct ly_ctx *, struct ly_in *, LYS_INFORMAT, LY_ERR (*)(const struct ly_ctx *, struct lysp_module *, struct lysp_submodule *, void *), void *, struct ly_set *, struct lys_module **)"
                 );
  }
  if (module != (lys_module **)0x0) {
    *module = (lys_module *)0x0;
  }
  local_60 = check_data;
  mod = (lys_module *)calloc(1,0x80);
  if (mod == (lys_module *)0x0) {
    ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_parse_in");
    return LY_EMEM;
  }
  mod->ctx = ctx;
  local_68 = new_mods;
  if (format == LYS_IN_YANG) {
    context = &local_70;
    LVar3 = yang_parse_module(context,in,mod);
LAB_0015b3b5:
    local_90 = *context;
  }
  else {
    if (format == LYS_IN_YIN) {
      context = &local_78;
      LVar3 = yin_parse_module((lysp_yin_ctx **)context,in,mod);
      goto LAB_0015b3b5;
    }
    local_90 = (lysp_yang_ctx *)0x0;
    LVar3 = LY_EINVAL;
    ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid schema input format.");
  }
  bVar1 = true;
  if (LVar3 != LY_SUCCESS) {
    local_88 = (lys_module *)0x0;
    goto LAB_0015b4f3;
  }
  lysp_sort_revisions(mod->parsed->revs);
  value = mod->parsed->revs;
  if (value != (lysp_revision *)0x0) {
    local_88 = (lys_module *)0x0;
    LVar3 = lydict_insert(ctx,value->date,0,&mod->revision);
    if (LVar3 != LY_SUCCESS) goto LAB_0015b4f3;
  }
  plVar5 = ly_ctx_get_module_latest(ctx,mod->name);
  if (plVar5 == (lys_module *)0x0) {
    bVar2 = 1;
    plVar5 = (lys_module *)0x0;
LAB_0015b474:
    mod->latest_revision = bVar2;
  }
  else {
    if ((mod->revision != (char *)0x0) &&
       ((plVar5->revision == (char *)0x0 ||
        (iVar4 = strcmp(mod->revision,plVar5->revision), 0 < iVar4)))) {
      bVar2 = plVar5->latest_revision & 3;
      goto LAB_0015b474;
    }
    plVar5 = (lys_module *)0x0;
  }
  if ((custom_check == (_func_LY_ERR_ly_ctx_ptr_lysp_module_ptr_lysp_submodule_ptr_void_ptr *)0x0)
     || (LVar3 = (*custom_check)(ctx,mod->parsed,(lysp_submodule *)0x0,local_60),
        LVar3 == LY_SUCCESS)) {
    local_88 = ly_ctx_get_module(ctx,mod->name,mod->revision);
    if (local_88 == (lys_module *)0x0) {
      local_88 = ly_ctx_get_module_latest_ns(ctx,mod->ns);
      if ((local_88 == (lys_module *)0x0) || (local_88->revision != mod->revision)) {
        if (in->type == LY_IN_ERROR) {
          LVar3 = LY_EINT;
          ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema.c"
                 ,0x777);
          goto LAB_0015b4f0;
        }
        if (in->type == LY_IN_FILEPATH) {
          ly_check_module_filename
                    (ctx,mod->name,mod->parsed->revs->date,(in->method).fpath.filepath);
        }
        lys_parser_fill_filepath(ctx,in,&mod->filepath);
        if (plVar5 != (lys_module *)0x0) {
          plVar5->latest_revision = plVar5->latest_revision & 0xfc;
        }
        pcVar7 = mod->name;
        iVar4 = strcmp(pcVar7,"ietf-netconf");
        if (iVar4 == 0) {
          LVar3 = lysp_add_internal_ietf_netconf((lysp_ctx *)local_90,mod->parsed);
LAB_0015b6ed:
          if (LVar3 != LY_SUCCESS) goto LAB_0015b4f0;
        }
        else {
          iVar4 = strcmp(pcVar7,"ietf-netconf-with-defaults");
          if (iVar4 == 0) {
            LVar3 = lysp_add_internal_ietf_netconf_with_defaults((lysp_ctx *)local_90,mod->parsed);
            goto LAB_0015b6ed;
          }
          iVar4 = strcmp(pcVar7,"yang");
          if (iVar4 == 0) {
            LVar3 = lysp_add_internal_yang((lysp_ctx *)local_90,mod->parsed);
            goto LAB_0015b6ed;
          }
        }
        new_mods_00 = local_68;
        LVar3 = ly_set_add(local_68,mod,'\x01',(uint32_t *)0x0);
        if (LVar3 == LY_SUCCESS) {
          bVar1 = false;
          LVar3 = ly_set_add(&ctx->list,mod,'\x01',(uint32_t *)0x0);
          if (LVar3 == LY_SUCCESS) {
            ctx->change_count = ctx->change_count + 1;
            LVar3 = lysp_resolve_import_include((lysp_ctx *)local_90,mod->parsed,new_mods_00);
            if (((((LVar3 == LY_SUCCESS) &&
                  (LVar3 = lysp_resolve_ext_instance_records((lysp_ctx *)local_90),
                  LVar3 == LY_SUCCESS)) &&
                 (LVar3 = lysp_check_dup_typedefs((lysp_ctx *)local_90,mod->parsed),
                 LVar3 == LY_SUCCESS)) &&
                ((LVar3 = lysp_check_dup_groupings((lysp_ctx *)local_90,mod->parsed),
                 LVar3 == LY_SUCCESS &&
                 (LVar3 = lysp_check_dup_features((lysp_ctx *)local_90,mod->parsed),
                 LVar3 == LY_SUCCESS)))) &&
               ((LVar3 = lysp_check_dup_identities((lysp_ctx *)local_90,mod->parsed),
                LVar3 == LY_SUCCESS &&
                (LVar3 = lys_compile_feature_iffeatures(mod->parsed), LVar3 == LY_SUCCESS)))) {
              LVar3 = lys_compile_identities(mod);
            }
            bVar1 = false;
          }
          goto LAB_0015b4f3;
        }
        goto LAB_0015b4f0;
      }
      pcVar7 = local_88->name;
      pcVar8 = mod->name;
      format_00 = "Two different modules (\"%s\" and \"%s\") have the same namespace \"%s\".";
      LVar3 = LY_EINVAL;
      level = LY_LLERR;
      err = LY_EINVAL;
      ctx_00 = ctx;
    }
    else {
      pcVar7 = local_88->name;
      pcVar8 = "<none>";
      if (local_88->revision != (char *)0x0) {
        pcVar8 = local_88->revision;
      }
      format_00 = "Module \"%s@%s\" is already present in the context.";
      LVar3 = LY_SUCCESS;
      level = LY_LLVRB;
      err = LY_SUCCESS;
      ctx_00 = (ly_ctx *)0x0;
    }
    ly_log(ctx_00,level,err,format_00,pcVar7,pcVar8);
  }
  else {
    local_88 = (lys_module *)0x0;
  }
LAB_0015b4f0:
  bVar1 = true;
LAB_0015b4f3:
  if ((((LVar3 & ~LY_EEXIST) != LY_SUCCESS) && (mod->name != (char *)0x0)) &&
     ((plVar6 = ly_err_last(ctx), plVar6 != (ly_err_item *)0x0 &&
      ((plVar6->schema_path == (char *)0x0 || (plVar6->line != 0)))))) {
    ly_log(ctx,LY_LLERR,LY_EOTHER,"Parsing module \"%s\" failed.",mod->name);
  }
  if (bVar1) {
    local_58.mod = mod;
    lys_module_free(&local_58,mod,'\0');
    lysf_ctx_erase(&local_58);
    mod = local_88;
  }
  if (format == LYS_IN_YANG) {
    lysp_yang_ctx_free(local_70);
  }
  else {
    lysp_yin_ctx_free((lysp_yin_ctx *)local_78);
  }
  if ((module != (lys_module **)0x0) && (LVar3 == LY_SUCCESS)) {
    *module = mod;
  }
  return LVar3;
}

Assistant:

LY_ERR
lys_parse_in(struct ly_ctx *ctx, struct ly_in *in, LYS_INFORMAT format,
        LY_ERR (*custom_check)(const struct ly_ctx *ctx, struct lysp_module *mod, struct lysp_submodule *submod, void *data),
        void *check_data, struct ly_set *new_mods, struct lys_module **module)
{
    struct lys_module *mod = NULL, *latest, *mod_dup = NULL;
    LY_ERR ret;
    struct lysp_yang_ctx *yangctx = NULL;
    struct lysp_yin_ctx *yinctx = NULL;
    struct lysp_ctx *pctx = NULL;
    struct lysf_ctx fctx = {.ctx = ctx};
    ly_bool module_created = 0;

    assert(ctx && in && new_mods);

    if (module) {
        *module = NULL;
    }

    mod = calloc(1, sizeof *mod);
    LY_CHECK_ERR_RET(!mod, LOGMEM(ctx), LY_EMEM);
    mod->ctx = ctx;

    /* parse */
    switch (format) {
    case LYS_IN_YIN:
        ret = yin_parse_module(&yinctx, in, mod);
        pctx = (struct lysp_ctx *)yinctx;
        break;
    case LYS_IN_YANG:
        ret = yang_parse_module(&yangctx, in, mod);
        pctx = (struct lysp_ctx *)yangctx;
        break;
    default:
        LOGERR(ctx, LY_EINVAL, "Invalid schema input format.");
        ret = LY_EINVAL;
        break;
    }
    LY_CHECK_GOTO(ret, cleanup);

    /* make sure that the newest revision is at position 0 */
    lysp_sort_revisions(mod->parsed->revs);
    if (mod->parsed->revs) {
        LY_CHECK_GOTO(ret = lydict_insert(ctx, mod->parsed->revs[0].date, 0, &mod->revision), cleanup);
    }

    /* decide the latest revision */
    latest = ly_ctx_get_module_latest(ctx, mod->name);
    if (latest) {
        if (mod->revision) {
            if (!latest->revision) {
                /* latest has no revision, so mod is anyway newer */
                mod->latest_revision = latest->latest_revision & (LYS_MOD_LATEST_REV | LYS_MOD_LATEST_SEARCHDIRS);
                /* the latest is zeroed later when the new module is being inserted into the context */
            } else if (strcmp(mod->revision, latest->revision) > 0) {
                mod->latest_revision = latest->latest_revision & (LYS_MOD_LATEST_REV | LYS_MOD_LATEST_SEARCHDIRS);
                /* the latest is zeroed later when the new module is being inserted into the context */
            } else {
                latest = NULL;
            }
        } else {
            latest = NULL;
        }
    } else {
        mod->latest_revision = LYS_MOD_LATEST_REV;
    }

    if (custom_check) {
        LY_CHECK_GOTO(ret = custom_check(ctx, mod->parsed, NULL, check_data), cleanup);
    }

    /* check whether it is not already in the context in the same revision */
    mod_dup = ly_ctx_get_module(ctx, mod->name, mod->revision);
    if (mod_dup) {
        /* nothing to do */
        LOGVRB("Module \"%s@%s\" is already present in the context.", mod_dup->name,
                mod_dup->revision ? mod_dup->revision : "<none>");
        goto cleanup;
    }

    /* check whether there is not a namespace collision */
    mod_dup = ly_ctx_get_module_latest_ns(ctx, mod->ns);
    if (mod_dup && (mod_dup->revision == mod->revision)) {
        LOGERR(ctx, LY_EINVAL, "Two different modules (\"%s\" and \"%s\") have the same namespace \"%s\".",
                mod_dup->name, mod->name, mod->ns);
        ret = LY_EINVAL;
        goto cleanup;
    }

    switch (in->type) {
    case LY_IN_FILEPATH:
        ly_check_module_filename(ctx, mod->name, mod->parsed->revs ? mod->parsed->revs[0].date : NULL, in->method.fpath.filepath);
        break;
    case LY_IN_FD:
    case LY_IN_FILE:
    case LY_IN_MEMORY:
        /* nothing special to do */
        break;
    case LY_IN_ERROR:
        LOGINT(ctx);
        ret = LY_EINT;
        goto cleanup;
    }
    lys_parser_fill_filepath(ctx, in, &mod->filepath);

    if (latest) {
        latest->latest_revision &= ~(LYS_MOD_LATEST_REV | LYS_MOD_LATEST_SEARCHDIRS);
    }

    /* add internal data in case specific modules were parsed */
    if (!strcmp(mod->name, "ietf-netconf")) {
        LY_CHECK_GOTO(ret = lysp_add_internal_ietf_netconf(pctx, mod->parsed), cleanup);
    } else if (!strcmp(mod->name, "ietf-netconf-with-defaults")) {
        LY_CHECK_GOTO(ret = lysp_add_internal_ietf_netconf_with_defaults(pctx, mod->parsed), cleanup);
    } else if (!strcmp(mod->name, "yang")) {
        LY_CHECK_GOTO(ret = lysp_add_internal_yang(pctx, mod->parsed), cleanup);
    }

    /* add the module into newly created module set, will also be freed from there on any error */
    LY_CHECK_GOTO(ret = ly_set_add(new_mods, mod, 1, NULL), cleanup);
    module_created = 1;

    /* add into context */
    ret = ly_set_add(&ctx->list, mod, 1, NULL);
    LY_CHECK_GOTO(ret, cleanup);
    ctx->change_count++;

    /* resolve includes and all imports */
    LY_CHECK_GOTO(ret = lysp_resolve_import_include(pctx, mod->parsed, new_mods), cleanup);

    /* resolve extension instance plugin records */
    LY_CHECK_GOTO(ret = lysp_resolve_ext_instance_records(pctx), cleanup);

    /* check name collisions */
    LY_CHECK_GOTO(ret = lysp_check_dup_typedefs(pctx, mod->parsed), cleanup);
    LY_CHECK_GOTO(ret = lysp_check_dup_groupings(pctx, mod->parsed), cleanup);
    LY_CHECK_GOTO(ret = lysp_check_dup_features(pctx, mod->parsed), cleanup);
    LY_CHECK_GOTO(ret = lysp_check_dup_identities(pctx, mod->parsed), cleanup);

    /* compile features */
    LY_CHECK_GOTO(ret = lys_compile_feature_iffeatures(mod->parsed), cleanup);

    /* compile identities */
    LY_CHECK_GOTO(ret = lys_compile_identities(mod), cleanup);

cleanup:
    if (ret && (ret != LY_EEXIST)) {
        if (mod && mod->name) {
            /* there are cases when path is not available for parsing error, so this additional
             * message tries to add information about the module where the error occurred */
            const struct ly_err_item *e = ly_err_last(ctx);

            if (e && (!e->schema_path || e->line)) {
                LOGERR(ctx, LY_EOTHER, "Parsing module \"%s\" failed.", mod->name);
            }
        }
    }
    if (!module_created) {
        fctx.mod = mod;
        lys_module_free(&fctx, mod, 0);
        lysf_ctx_erase(&fctx);

        mod = mod_dup;
    }

    if (format == LYS_IN_YANG) {
        lysp_yang_ctx_free(yangctx);
    } else {
        lysp_yin_ctx_free(yinctx);
    }

    if (!ret && module) {
        *module = mod;
    }
    return ret;
}